

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExponentiallyDecayingReservoir.cc
# Opt level: O1

void __thiscall
cppmetrics::ExponentiallyDecayingReservoir::ExponentiallyDecayingReservoir
          (ExponentiallyDecayingReservoir *this,size_t size,double alpha,Clock *clock)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  undefined4 extraout_var;
  
  (this->super_Reservoir)._vptr_Reservoir =
       (_func_int **)&PTR__ExponentiallyDecayingReservoir_001208a0;
  (this->m_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->m_mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->m_count).super___atomic_base<long>._M_i = 0;
  if (clock == (Clock *)0x0) {
    clock = GetDefaultClock();
  }
  this->m_clock = clock;
  iVar2 = (*clock->_vptr_Clock[1])(clock);
  this->m_start = CONCAT44(extraout_var,iVar2);
  this->m_next_rescale_time = CONCAT44(extraout_var,iVar2) + 0x3c;
  this->m_size = size;
  this->m_alpha = alpha;
  p_Var1 = &(this->m_samples)._M_t._M_impl.super__Rb_tree_header;
  (this->m_samples)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_samples)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (this->m_samples)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->m_samples)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->m_samples)._M_t._M_impl = 0;
  *(undefined8 *)&(this->m_samples)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->m_samples)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_samples)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_samples)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

ExponentiallyDecayingReservoir::ExponentiallyDecayingReservoir(std::size_t size, double alpha, Clock* clock)
    : m_mutex()
    , m_count(0)
    , m_clock(clock != nullptr ? clock : GetDefaultClock())
    , m_start(m_clock->now_as_time_t())
    , m_next_rescale_time(m_start + kRescalePeriod)
    , m_size(size)
    , m_alpha(alpha)
    , m_samples()
{}